

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int patternCompare(u8 *zPattern,u8 *zString,compareInfo *pInfo,u32 matchOther)

{
  byte bVar1;
  u8 uVar2;
  bool bVar3;
  u32 uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uchar *puVar8;
  size_t sVar9;
  bool bVar10;
  int iVar11;
  u8 *puVar12;
  u32 uVar13;
  u32 uVar14;
  byte *pbVar15;
  bool bVar16;
  u8 *local_60;
  byte local_53;
  uchar local_52;
  uchar local_51;
  byte *local_50;
  uint local_48;
  uint local_44;
  compareInfo *local_40;
  u8 *local_38;
  
  local_44 = (uint)pInfo->matchOne;
  bVar1 = pInfo->matchAll;
  uVar2 = pInfo->noCase;
  local_38 = (u8 *)0x0;
  local_60 = zPattern;
  local_50 = zString;
  local_48 = matchOther;
  local_40 = pInfo;
LAB_0011eb42:
  uVar13 = (u32)(char)*local_60;
  if ((char)*local_60 < '\0') {
    uVar13 = sqlite3Utf8Read(&local_60);
  }
  else {
    local_60 = local_60 + 1;
  }
  if (uVar13 == 0) {
    return (uint)(*local_50 != 0);
  }
  if (uVar13 != bVar1) {
    if (uVar13 == local_48) {
      if (local_40->matchSet != '\0') {
        uVar13 = sqlite3Utf8Read(&local_50);
        if (uVar13 == 0) {
          return 1;
        }
        uVar4 = sqlite3Utf8Read(&local_60);
        uVar14 = 0;
        bVar16 = uVar4 == 0x5e;
        if (bVar16) {
          uVar4 = sqlite3Utf8Read(&local_60);
        }
        bVar10 = false;
        if (uVar4 != 0x5d) goto LAB_0011eca6;
        bVar10 = uVar13 == 0x5d;
LAB_0011ec97:
        uVar14 = 0;
LAB_0011ec99:
        uVar4 = sqlite3Utf8Read(&local_60);
LAB_0011eca6:
        if (uVar4 == 0x2d) {
          if ((*local_60 != ']') && (uVar14 != 0 && *local_60 != '\0')) goto code_r0x0011ece5;
        }
        else {
          if (uVar4 == 0x5d) {
            if (bVar10 == bVar16) {
              return 1;
            }
            goto LAB_0011eb42;
          }
          if (uVar4 == 0) {
            return 1;
          }
        }
        uVar14 = uVar4;
        if (uVar13 == uVar4) {
          bVar10 = true;
        }
        goto LAB_0011ec99;
      }
      uVar13 = sqlite3Utf8Read(&local_60);
      if (uVar13 == 0) {
        return 1;
      }
      local_38 = local_60;
    }
    uVar5 = (uint)(char)*local_50;
    if ((char)*local_50 < '\0') {
      uVar5 = sqlite3Utf8Read(&local_50);
    }
    else {
      local_50 = local_50 + 1;
    }
    if ((uVar13 != uVar5) &&
       (((uVar2 == '\0' || (0x7f < (uVar5 | uVar13))) || (""[uVar13 & 0xff] != ""[uVar5 & 0xff]))))
    {
      if (uVar13 != local_44) {
        return 1;
      }
      if (uVar5 == 0) {
        return 1;
      }
      if (local_60 == local_38) {
        return 1;
      }
    }
    goto LAB_0011eb42;
  }
  while( true ) {
    uVar13 = (u32)(char)*local_60;
    if ((char)*local_60 < '\0') {
      uVar13 = sqlite3Utf8Read(&local_60);
    }
    else {
      local_60 = local_60 + 1;
    }
    if ((uVar13 != bVar1) && ((char)local_44 == '\0' || uVar13 != local_44)) break;
    if ((uVar13 == local_44) && (uVar13 = sqlite3Utf8Read(&local_50), uVar13 == 0)) {
      return 2;
    }
  }
  if (uVar13 == 0) {
    return 0;
  }
  if (uVar13 == local_48) {
    if (local_40->matchSet != '\0') {
      puVar12 = local_60 + -1;
      pbVar15 = local_50;
      iVar7 = 1;
      do {
        bVar1 = *pbVar15;
        if (bVar1 == 0) {
          return 2;
        }
        iVar6 = patternCompare(puVar12,pbVar15,local_40,local_48);
        iVar11 = iVar6;
        if (iVar6 == 1) {
          iVar11 = iVar7;
          if (bVar1 < 0xc0) {
            pbVar15 = pbVar15 + 1;
          }
          else {
            pbVar15 = pbVar15 + 1;
          }
        }
        iVar7 = iVar11;
      } while (iVar6 == 1);
      return iVar11;
    }
    uVar13 = sqlite3Utf8Read(&local_60);
    if (uVar13 == 0) {
      return 2;
    }
  }
  puVar12 = local_60;
  if (0x80 < uVar13) {
    while( true ) {
      uVar14 = (u32)(char)*local_50;
      if ((char)*local_50 < '\0') {
        uVar14 = sqlite3Utf8Read(&local_50);
      }
      else {
        local_50 = local_50 + 1;
      }
      if (uVar14 == 0) break;
      if ((uVar14 == uVar13) &&
         (iVar7 = patternCompare(puVar12,local_50,local_40,local_48), iVar7 != 1)) {
LAB_0011eeb5:
        if (uVar14 == 0) {
          return 2;
        }
        return iVar7;
      }
    }
    iVar7 = 1;
    goto LAB_0011eeb5;
  }
  local_53 = (byte)uVar13;
  if (uVar2 == '\0') {
    puVar8 = &local_52;
  }
  else {
    local_53 = local_53 & (~""[uVar13] | 0xdf);
    local_52 = ""[uVar13];
    puVar8 = &local_51;
  }
  *puVar8 = '\0';
  pbVar15 = local_50;
  do {
    sVar9 = strcspn((char *)pbVar15,(char *)&local_53);
    bVar1 = pbVar15[sVar9];
    if (bVar1 == 0) {
      iVar7 = 1;
      break;
    }
    pbVar15 = pbVar15 + sVar9 + 1;
    iVar7 = patternCompare(puVar12,pbVar15,local_40,local_48);
  } while (iVar7 == 1);
  if (bVar1 == 0) {
    return 2;
  }
  return iVar7;
code_r0x0011ece5:
  uVar4 = sqlite3Utf8Read(&local_60);
  bVar3 = true;
  if (uVar4 < uVar13) {
    bVar3 = bVar10;
  }
  if (uVar14 <= uVar13) {
    bVar10 = bVar3;
  }
  goto LAB_0011ec97;
}

Assistant:

static int patternCompare(
  const u8 *zPattern,              /* The glob pattern */
  const u8 *zString,               /* The string to compare against the glob */
  const struct compareInfo *pInfo, /* Information about how to do the compare */
  u32 matchOther                   /* The escape char (LIKE) or '[' (GLOB) */
){
  u32 c, c2;                       /* Next pattern and input string chars */
  u32 matchOne = pInfo->matchOne;  /* "?" or "_" */
  u32 matchAll = pInfo->matchAll;  /* "*" or "%" */
  u8 noCase = pInfo->noCase;       /* True if uppercase==lowercase */
  const u8 *zEscaped = 0;          /* One past the last escaped input char */

  while( (c = Utf8Read(zPattern))!=0 ){
    if( c==matchAll ){  /* Match "*" */
      /* Skip over multiple "*" characters in the pattern.  If there
      ** are also "?" characters, skip those as well, but consume a
      ** single character of the input string for each "?" skipped */
      while( (c=Utf8Read(zPattern)) == matchAll
             || (c == matchOne && matchOne!=0) ){
        if( c==matchOne && sqlite3Utf8Read(&zString)==0 ){
          return SQLITE_NOWILDCARDMATCH;
        }
      }
      if( c==0 ){
        return SQLITE_MATCH;   /* "*" at the end of the pattern matches */
      }else if( c==matchOther ){
        if( pInfo->matchSet==0 ){
          c = sqlite3Utf8Read(&zPattern);
          if( c==0 ) return SQLITE_NOWILDCARDMATCH;
        }else{
          /* "[...]" immediately follows the "*".  We have to do a slow
          ** recursive search in this case, but it is an unusual case. */
          assert( matchOther<0x80 );  /* '[' is a single-byte character */
          while( *zString ){
            int bMatch = patternCompare(&zPattern[-1],zString,pInfo,matchOther);
            if( bMatch!=SQLITE_NOMATCH ) return bMatch;
            SQLITE_SKIP_UTF8(zString);
          }
          return SQLITE_NOWILDCARDMATCH;
        }
      }

      /* At this point variable c contains the first character of the
      ** pattern string past the "*".  Search in the input string for the
      ** first matching character and recursively continue the match from
      ** that point.
      **
      ** For a case-insensitive search, set variable cx to be the same as
      ** c but in the other case and search the input string for either
      ** c or cx.
      */
      if( c<=0x80 ){
        char zStop[3];
        int bMatch;
        if( noCase ){
          zStop[0] = sqlite3Toupper(c);
          zStop[1] = sqlite3Tolower(c);
          zStop[2] = 0;
        }else{
          zStop[0] = c;
          zStop[1] = 0;
        }
        while(1){
          zString += strcspn((const char*)zString, zStop);
          if( zString[0]==0 ) break;
          zString++;
          bMatch = patternCompare(zPattern,zString,pInfo,matchOther);
          if( bMatch!=SQLITE_NOMATCH ) return bMatch;
        }
      }else{
        int bMatch;
        while( (c2 = Utf8Read(zString))!=0 ){
          if( c2!=c ) continue;
          bMatch = patternCompare(zPattern,zString,pInfo,matchOther);
          if( bMatch!=SQLITE_NOMATCH ) return bMatch;
        }
      }
      return SQLITE_NOWILDCARDMATCH;
    }
    if( c==matchOther ){
      if( pInfo->matchSet==0 ){
        c = sqlite3Utf8Read(&zPattern);
        if( c==0 ) return SQLITE_NOMATCH;
        zEscaped = zPattern;
      }else{
        u32 prior_c = 0;
        int seen = 0;
        int invert = 0;
        c = sqlite3Utf8Read(&zString);
        if( c==0 ) return SQLITE_NOMATCH;
        c2 = sqlite3Utf8Read(&zPattern);
        if( c2=='^' ){
          invert = 1;
          c2 = sqlite3Utf8Read(&zPattern);
        }
        if( c2==']' ){
          if( c==']' ) seen = 1;
          c2 = sqlite3Utf8Read(&zPattern);
        }
        while( c2 && c2!=']' ){
          if( c2=='-' && zPattern[0]!=']' && zPattern[0]!=0 && prior_c>0 ){
            c2 = sqlite3Utf8Read(&zPattern);
            if( c>=prior_c && c<=c2 ) seen = 1;
            prior_c = 0;
          }else{
            if( c==c2 ){
              seen = 1;
            }
            prior_c = c2;
          }
          c2 = sqlite3Utf8Read(&zPattern);
        }
        if( c2==0 || (seen ^ invert)==0 ){
          return SQLITE_NOMATCH;
        }
        continue;
      }
    }
    c2 = Utf8Read(zString);
    if( c==c2 ) continue;
    if( noCase  && sqlite3Tolower(c)==sqlite3Tolower(c2) && c<0x80 && c2<0x80 ){
      continue;
    }
    if( c==matchOne && zPattern!=zEscaped && c2!=0 ) continue;
    return SQLITE_NOMATCH;
  }
  return *zString==0 ? SQLITE_MATCH : SQLITE_NOMATCH;
}